

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O2

StringVector * __thiscall
CoreML::Specification::KNearestNeighborsClassifier::mutable_stringclasslabels
          (KNearestNeighborsClassifier *this)

{
  StringVector *this_00;
  
  if (this->_oneof_case_[0] == 100) {
    this_00 = (this->ClassLabels_).stringclasslabels_;
  }
  else {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 100;
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    (this->ClassLabels_).stringclasslabels_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::StringVector* KNearestNeighborsClassifier::mutable_stringclasslabels() {
  if (!has_stringclasslabels()) {
    clear_ClassLabels();
    set_has_stringclasslabels();
    ClassLabels_.stringclasslabels_ = new ::CoreML::Specification::StringVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.KNearestNeighborsClassifier.stringClassLabels)
  return ClassLabels_.stringclasslabels_;
}